

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

Result<void> * init::SetLoggingCategories(Result<void> *__return_storage_ptr__,ArgsManager *args)

{
  pointer pbVar1;
  bool bVar2;
  Logger *pLVar3;
  long lVar4;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  bilingual_str *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  pointer pbVar5;
  long lVar6;
  pointer pbVar7;
  pointer args_00;
  pointer this_00;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  categories;
  allocator<char> local_111;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  bilingual_str local_f8;
  bilingual_str local_b8;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"-debug",(allocator<char> *)&local_110);
  bVar2 = ArgsManager::IsArgSet(args,&local_b8.original);
  std::__cxx11::string::~string((string *)&local_b8);
  if (!bVar2) goto LAB_00a75b77;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"-debug",&local_111);
  __it._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  ArgsManager::GetArgs(&local_110,args,&local_b8.original);
  std::__cxx11::string::~string((string *)&local_b8);
  pbVar7 = local_110.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_110.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  this_00 = local_110.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (lVar4 = lVar6 >> 7; pbVar5 = this_00, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::$_0>::
            operator()((_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::__0> *)this_00,
                       __it);
    if (bVar2) goto LAB_00a75b64;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::$_0>::
            operator()((_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::__0> *)
                       (this_00 + 1),__it);
    pbVar5 = this_00 + 1;
    if (bVar2) goto LAB_00a75b64;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::$_0>::
            operator()((_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::__0> *)
                       (this_00 + 2),__it);
    pbVar5 = this_00 + 2;
    if (bVar2) goto LAB_00a75b64;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::$_0>::
            operator()((_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::__0> *)
                       (this_00 + 3),__it);
    pbVar5 = this_00 + 3;
    if (bVar2) goto LAB_00a75b64;
    this_00 = this_00 + 4;
    lVar6 = lVar6 + -0x80;
  }
  lVar6 = lVar6 >> 5;
  if (lVar6 == 1) {
LAB_00a75cff:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::$_0>::
            operator()((_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::__0> *)this_00,
                       __it);
    pbVar5 = this_00;
    if (!bVar2) {
      pbVar5 = pbVar7;
    }
LAB_00a75b64:
    args_00 = local_110.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = local_110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar5 == pbVar7) goto LAB_00a75c72;
  }
  else {
    if (lVar6 == 2) {
LAB_00a75ce8:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::$_0>::
              operator()((_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::__0> *)this_00,
                         __it);
      pbVar5 = this_00;
      if (!bVar2) {
        this_00 = this_00 + 1;
        goto LAB_00a75cff;
      }
      goto LAB_00a75b64;
    }
    args_00 = local_110.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = local_110.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (lVar6 == 3) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::$_0>::
              operator()((_Iter_pred<init::SetLoggingCategories(ArgsManager_const&)::__0> *)this_00,
                         __it);
      if (!bVar2) {
        this_00 = this_00 + 1;
        goto LAB_00a75ce8;
      }
      goto LAB_00a75b64;
    }
LAB_00a75c72:
    for (; args_00 != pbVar1; args_00 = args_00 + 1) {
      pLVar3 = LogInstance();
      str_00._M_str = (args_00->_M_dataplus)._M_p;
      str_00._M_len = args_00->_M_string_length;
      bVar2 = BCLog::Logger::EnableCategory(pLVar3,str_00);
      if (!bVar2) {
        _(&local_b8,(ConstevalStringLiteral)0xe25e82);
        tinyformat::format<char[7],std::__cxx11::string>
                  (&local_78,(tinyformat *)&local_b8,(bilingual_str *)0xc90622,(char (*) [7])args_00
                   ,in_R8);
        std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                   &local_78);
        this = &local_78;
        goto LAB_00a75c23;
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_110);
LAB_00a75b77:
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"-debugexclude",&local_111)
  ;
  ArgsManager::GetArgs(&local_110,args,&local_b8.original);
  std::__cxx11::string::~string((string *)&local_b8);
  pbVar7 = local_110.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar7 == local_110.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_110);
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_std::monostate>.
               super__Move_assign_alias<bilingual_str,_std::monostate>.
               super__Copy_assign_alias<bilingual_str,_std::monostate>.
               super__Move_ctor_alias<bilingual_str,_std::monostate>.
               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
               super__Variant_storage_alias<bilingual_str,_std::monostate> + 0x40) = '\x01';
LAB_00a75c3c:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return __return_storage_ptr__;
    }
    pLVar3 = LogInstance();
    str._M_str = (pbVar7->_M_dataplus)._M_p;
    str._M_len = pbVar7->_M_string_length;
    bVar2 = BCLog::Logger::DisableCategory(pLVar3,str);
    if (!bVar2) {
      _(&local_b8,(ConstevalStringLiteral)0xe25e82);
      tinyformat::format<char[14],std::__cxx11::string>
                (&local_f8,(tinyformat *)&local_b8,(bilingual_str *)"-debugexclude",
                 (char (*) [14])pbVar7,in_R8);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,std::monostate>::
      _Variant_storage<0ul,bilingual_str>
                ((_Variant_storage<false,bilingual_str,std::monostate> *)__return_storage_ptr__,
                 &local_f8);
      this = &local_f8;
LAB_00a75c23:
      bilingual_str::~bilingual_str(this);
      bilingual_str::~bilingual_str(&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_110);
      goto LAB_00a75c3c;
    }
    pbVar7 = pbVar7 + 1;
  } while( true );
}

Assistant:

util::Result<void> SetLoggingCategories(const ArgsManager& args)
{
    if (args.IsArgSet("-debug")) {
        // Special-case: if -debug=0/-nodebug is set, turn off debugging messages
        const std::vector<std::string> categories = args.GetArgs("-debug");

        if (std::none_of(categories.begin(), categories.end(),
            [](std::string cat){return cat == "0" || cat == "none";})) {
            for (const auto& cat : categories) {
                if (!LogInstance().EnableCategory(cat)) {
                    return util::Error{strprintf(_("Unsupported logging category %s=%s."), "-debug", cat)};
                }
            }
        }
    }

    // Now remove the logging categories which were explicitly excluded
    for (const std::string& cat : args.GetArgs("-debugexclude")) {
        if (!LogInstance().DisableCategory(cat)) {
            return util::Error{strprintf(_("Unsupported logging category %s=%s."), "-debugexclude", cat)};
        }
    }
    return {};
}